

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

void e_died(entity *etmp,int dest,int how)

{
  entity *peVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar12 [16];
  coord xy;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (etmp->emon == &youmonst) {
    if (how == 5) {
      killer = (char *)0x0;
      lava_effects();
    }
    else if (how == 4) {
      killer = (char *)0x0;
      drown();
    }
    else {
      if (killer == (char *)0x0) {
        killer_format = 0;
        killer = "falling drawbridge";
      }
      done(how);
      bVar2 = e_survives_at(etmp,etmp->ex,etmp->ey);
      if (bVar2 == '\0') {
        bVar2 = enexto(&xy,level,(xchar)etmp->ex,(xchar)etmp->ey,etmp->edata);
        if (bVar2 != '\0') {
          pcVar4 = "strange";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar4 = "normal";
            }
            else {
              bVar2 = dmgtype(youmonst.data,0x24);
              pcVar4 = "strange";
              if (bVar2 == '\0') {
                pcVar4 = "normal";
              }
            }
          }
          pline("A %s force teleports you away...",pcVar4);
          teleds((int)xy.x,(int)xy.y,'\0');
        }
      }
    }
    auVar11._8_6_ = 0;
    auVar11[0] = u.ux;
    auVar11[1] = u.uy;
    auVar11[2] = u.dx;
    auVar11[3] = u.dy;
    auVar11[4] = u.tx;
    auVar11[5] = u.ty;
    auVar11[6] = u.ux0;
    auVar11[7] = u.uy0;
    auVar11[0xe] = u.uy0;
    auVar11[0xf] = u.uy0;
    auVar10._14_2_ = auVar11._14_2_;
    auVar10._8_5_ = 0;
    auVar10[0] = u.ux;
    auVar10[1] = u.uy;
    auVar10[2] = u.dx;
    auVar10[3] = u.dy;
    auVar10[4] = u.tx;
    auVar10[5] = u.ty;
    auVar10[6] = u.ux0;
    auVar10[7] = u.uy0;
    auVar10[0xd] = u.ux0;
    auVar9._13_3_ = auVar10._13_3_;
    auVar9._8_4_ = 0;
    auVar9[0] = u.ux;
    auVar9[1] = u.uy;
    auVar9[2] = u.dx;
    auVar9[3] = u.dy;
    auVar9[4] = u.tx;
    auVar9[5] = u.ty;
    auVar9[6] = u.ux0;
    auVar9[7] = u.uy0;
    auVar9[0xc] = u.ux0;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._8_3_ = 0;
    auVar8[0] = u.ux;
    auVar8[1] = u.uy;
    auVar8[2] = u.dx;
    auVar8[3] = u.dy;
    auVar8[4] = u.tx;
    auVar8[5] = u.ty;
    auVar8[6] = u.ux0;
    auVar8[7] = u.uy0;
    auVar8[0xb] = u.ty;
    auVar7._11_5_ = auVar8._11_5_;
    auVar7._8_2_ = 0;
    auVar7[0] = u.ux;
    auVar7[1] = u.uy;
    auVar7[2] = u.dx;
    auVar7[3] = u.dy;
    auVar7[4] = u.tx;
    auVar7[5] = u.ty;
    auVar7[6] = u.ux0;
    auVar7[7] = u.uy0;
    auVar7[10] = u.ty;
    auVar6._10_6_ = auVar7._10_6_;
    auVar6[8] = 0;
    auVar6[0] = u.ux;
    auVar6[1] = u.uy;
    auVar6[2] = u.dx;
    auVar6[3] = u.dy;
    auVar6[4] = u.tx;
    auVar6[5] = u.ty;
    auVar6[6] = u.ux0;
    auVar6[7] = u.uy0;
    auVar6[9] = u.tx;
    auVar5._9_7_ = auVar6._9_7_;
    auVar5[8] = u.tx;
    auVar5[0] = u.ux;
    auVar5[1] = u.uy;
    auVar5[2] = u.dx;
    auVar5[3] = u.dy;
    auVar5[4] = u.tx;
    auVar5[5] = u.ty;
    auVar5[6] = u.ux0;
    auVar5[7] = u.uy0;
    auVar12._8_8_ = auVar5._8_8_;
    auVar12[7] = u.dy;
    auVar12[6] = u.dy;
    auVar12[5] = u.dx;
    auVar12[4] = u.dx;
    auVar12[3] = u.uy;
    auVar12[2] = u.uy;
    auVar12[0] = u.ux;
    auVar12[1] = auVar12[0];
    auVar12 = pshuflw(auVar12,auVar12,0x60);
    etmp->ex = auVar12._0_4_ >> 0x18;
    etmp->ey = auVar12._4_4_ >> 0x18;
  }
  else {
    killer = (char *)0x0;
    if (flags.mon_moving == '\0') {
      xkilled(etmp->emon,dest);
    }
    else {
      pcVar4 = (char *)0x0;
      if ((dest & 1U) != 0) {
        pcVar4 = "";
      }
      monkilled(etmp->emon,pcVar4,(dest << 0x1e) >> 0x1f & 0x1a);
    }
    etmp->edata = (permonst *)0x0;
    for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0x18) {
      peVar1 = (entity *)((long)&occupants[0].emon + lVar3);
      if ((peVar1 != etmp) && (etmp->emon == peVar1->emon)) {
        *(undefined8 *)((long)&occupants[0].edata + lVar3) = 0;
      }
    }
  }
  return;
}

Assistant:

static void e_died(struct entity *etmp, int dest, int how)
{
	if (is_u(etmp)) {
		if (how == DROWNING) {
			killer = 0;	/* drown() sets its own killer */
			drown();
		} else if (how == BURNING) {
			killer = 0;	/* lava_effects() sets its own killer */
			lava_effects();
		} else {
			coord xy;

			/* use more specific killer if specified */
			if (!killer) {
			    killer_format = KILLED_BY_AN;
			    killer = "falling drawbridge";
			}
			done(how);
			/* So, you didn't die */
			if (!e_survives_at(etmp, etmp->ex, etmp->ey)) {
			    if (enexto(&xy, level, etmp->ex, etmp->ey, etmp->edata)) {
				pline("A %s force teleports you away...",
				      Hallucination ? "normal" : "strange");
				teleds(xy.x, xy.y, FALSE);
			    }
			    /* otherwise on top of the drawbridge is the
			     * only viable spot in the dungeon, so stay there
			     */
			}
		}
		/* we might have crawled out of the moat to survive */
		etmp->ex = u.ux,  etmp->ey = u.uy;
	} else {
		int entitycnt;

		killer = 0;
		/* fake "digested to death" damage-type suppresses corpse */
#define mk_message(dest) ((dest & 1) ? "" : NULL)
#define mk_corpse(dest)  ((dest & 2) ? AD_DGST : AD_PHYS)
		/* if monsters are moving, one of them caused the destruction */
		if (flags.mon_moving)
		    monkilled(etmp->emon, mk_message(dest), mk_corpse(dest));
		else		/* you caused it */
		    xkilled(etmp->emon, dest);
		etmp->edata = NULL;

		/* dead long worm handling */
		for (entitycnt = 0; entitycnt < ENTITIES; entitycnt++) {
		    if (etmp != &(occupants[entitycnt]) &&
			etmp->emon == occupants[entitycnt].emon)
			occupants[entitycnt].edata = NULL;
		}
#undef mk_message
#undef mk_corpse
	}
}